

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bc7decomp.cpp
# Opt level: O3

bool bc7decomp::unpack_bc7_mode1_3_7(uint32_t mode,void *pBlock_bits,color_rgba *pPixels)

{
  bool bVar1;
  uint8_t uVar2;
  uint32_t bits;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  undefined4 *puVar6;
  uint32_t i;
  uint uVar7;
  long lVar8;
  byte *pbVar9;
  uint32_t c;
  uint uVar10;
  ulong uVar11;
  uint8_t *puVar12;
  byte bVar13;
  uint32_t total_bits_1;
  bool bVar14;
  uint uVar15;
  uint32_t bits_1;
  uint32_t total_bits;
  uint uVar16;
  uint32_t total_bits_2;
  int iVar17;
  uint uVar18;
  uint32_t c_1;
  int iVar19;
  long lVar20;
  long lVar21;
  uint uVar22;
  long lVar23;
  uint32_t weights [16];
  byte local_d8 [4];
  byte local_d4 [12];
  uint auStack_c8 [4];
  anon_union_4_2_6eba8969_for_color_rgba_0 local_b8 [16];
  uint auStack_78 [10];
  color_rgba endpoints [4];
  uint32_t pbits [4];
  
  uVar22 = (uint)(mode == 1);
  uVar15 = 5;
  if (mode != 7) {
    uVar15 = uVar22 ^ 7;
  }
  uVar16 = 0;
  uVar4 = 0;
  uVar10 = mode + 1;
  if (uVar10 != 0) {
    lVar21 = (ulong)(mode == 7) + 3;
    uVar22 = uVar22 | 2;
    uVar3 = 0;
    uVar11 = 0;
    do {
      uVar7 = (uint)uVar11 & 7;
      iVar17 = 8 - uVar7;
      if ((int)(uVar10 - uVar3) <= iVar17) {
        iVar17 = uVar10 - uVar3;
      }
      uVar16 = uVar16 | (~(-1 << ((byte)iVar17 & 0x1f)) &
                        (uint)(*(byte *)((long)pBlock_bits + (uVar11 >> 3)) >> (sbyte)uVar7)) <<
                        ((byte)uVar3 & 0x1f);
      uVar3 = uVar3 + iVar17;
      uVar11 = (ulong)(iVar17 + (uint)uVar11);
    } while (uVar3 < uVar10);
    uVar4 = 0;
    if (uVar16 == 1 << ((byte)mode & 0x1f)) {
      uVar10 = 0;
      do {
        uVar3 = (uint)uVar11 & 7;
        uVar16 = 8 - uVar3;
        if (6 - uVar10 <= uVar16) {
          uVar16 = 6 - uVar10;
        }
        uVar3 = (uint)uVar4 |
                (~(-1 << ((byte)uVar16 & 0x1f)) &
                (uint)(*(byte *)((long)pBlock_bits + (uVar11 >> 3)) >> (sbyte)uVar3)) <<
                ((byte)uVar10 & 0x1f);
        uVar4 = (ulong)uVar3;
        uVar10 = uVar10 + uVar16;
        uVar11 = (ulong)(uVar16 + (uint)uVar11);
      } while (uVar10 < 6);
      lVar5 = 0;
      do {
        lVar8 = 0;
        do {
          uVar16 = 0;
          uVar10 = 0;
          do {
            uVar18 = (uint)uVar11;
            uVar7 = uVar18 & 7;
            iVar19 = uVar15 - uVar10;
            iVar17 = 8 - uVar7;
            if (iVar19 <= (int)(8 - uVar7)) {
              iVar17 = iVar19;
            }
            uVar16 = uVar16 | (~(-1 << ((byte)iVar17 & 0x1f)) &
                              (uint)(*(byte *)((long)pBlock_bits + (uVar11 >> 3)) >> (sbyte)uVar7))
                              << ((byte)uVar10 & 0x1f);
            uVar10 = uVar10 + iVar17;
            uVar11 = (ulong)(iVar17 + uVar18);
          } while (uVar10 < uVar15);
          local_d8[lVar8 * 4 + lVar5] = (byte)uVar16;
          lVar8 = lVar8 + 1;
        } while (lVar8 != 4);
        lVar5 = lVar5 + 1;
      } while (lVar5 != lVar21);
      iVar17 = 8 - uVar7;
      if (iVar19 < (int)(8 - uVar7)) {
        iVar17 = iVar19;
      }
      lVar5 = 0;
      do {
        uVar10 = iVar17 + uVar18 + (int)lVar5;
        auStack_c8[lVar5] =
             (uint)((*(byte *)((long)pBlock_bits + (ulong)(uVar10 >> 3)) >> (uVar10 & 7) & 1) != 0);
        lVar5 = lVar5 + 1;
      } while ((ulong)(mode != 1) * 2 + 2 != lVar5);
      iVar17 = 8 - uVar7;
      if (iVar19 < (int)(8 - uVar7)) {
        iVar17 = iVar19;
      }
      uVar10 = uVar18 + (int)lVar5 + iVar17;
      uVar11 = 0;
      do {
        uVar16 = uVar22 - 1;
        if ((uVar11 != 0) &&
           (uVar16 = uVar22, uVar11 == (byte)g_bc7_table_anchor_index_second_subset[uVar4])) {
          uVar16 = uVar22 - 1;
        }
        uVar7 = 0;
        uVar18 = 0;
        do {
          iVar17 = 8 - (uVar10 & 7);
          if ((int)(uVar16 - uVar18) <= iVar17) {
            iVar17 = uVar16 - uVar18;
          }
          uVar7 = uVar7 | (~(-1 << ((byte)iVar17 & 0x1f)) &
                          (uint)(*(byte *)((long)pBlock_bits + (ulong)(uVar10 >> 3)) >>
                                (sbyte)(uVar10 & 7))) << ((byte)uVar18 & 0x1f);
          uVar18 = uVar18 + iVar17;
          uVar10 = iVar17 + uVar10;
        } while (uVar18 < uVar16);
        auStack_78[uVar11] = uVar7;
        uVar11 = uVar11 + 1;
      } while (uVar11 != 0x10);
      pbVar9 = local_d8;
      lVar5 = 0;
      do {
        lVar8 = 0;
        do {
          bVar13 = 0xff;
          if (lVar21 != lVar8) {
            uVar10 = ((uint)pbVar9[lVar8] * 2 | auStack_c8[(uint)lVar5 >> (mode == 1)]) <<
                     ((byte)uVar15 ^ 7);
            bVar13 = (byte)(uVar10 >> (byte)uVar15 + 1) | (byte)uVar10;
          }
          pbVar9[lVar8] = bVar13;
          lVar8 = lVar8 + 1;
        } while (lVar8 != 4);
        lVar5 = lVar5 + 1;
        pbVar9 = pbVar9 + 4;
      } while (lVar5 != 4);
      lVar5 = 0;
      bVar1 = true;
      do {
        bVar14 = bVar1;
        lVar8 = lVar5 * 0x20;
        puVar12 = local_b8[0].m_comps + lVar8;
        lVar23 = 0;
        do {
          puVar6 = &g_bc7_weights2;
          if (mode == 1) {
            puVar6 = &g_bc7_weights3;
          }
          iVar17 = puVar6[lVar23];
          lVar20 = 0;
          do {
            puVar12[lVar20] =
                 (uint8_t)((uint)local_d8[lVar20 + lVar5 * 8] * (0x40 - iVar17) +
                           (uint)local_d4[lVar20 + lVar5 * 8] * iVar17 + 0x20 >> 6);
            lVar20 = lVar20 + 1;
          } while (lVar21 != lVar20);
          uVar2 = 0xff;
          if (mode == 7) {
            uVar2 = local_b8[0].m_comps[lVar23 * 4 + lVar8 + 3];
          }
          local_b8[0].m_comps[lVar23 * 4 + lVar8 + 3] = uVar2;
          lVar23 = lVar23 + 1;
          puVar12 = puVar12 + 4;
        } while ((uint)lVar23 >> (sbyte)uVar22 == 0);
        lVar5 = 1;
        bVar1 = false;
      } while (bVar14);
      lVar21 = 0;
      do {
        pPixels[lVar21].field_0 =
             local_b8[(ulong)(byte)g_bc7_partition2[(ulong)(uVar3 << 4) + lVar21] * 8 +
                      (ulong)auStack_78[lVar21]];
        lVar21 = lVar21 + 1;
      } while (lVar21 != 0x10);
      uVar4 = 1;
    }
  }
  return SUB81(uVar4,0);
}

Assistant:

bool unpack_bc7_mode1_3_7(uint32_t mode, const void* pBlock_bits, color_rgba* pPixels)
{
	//const uint32_t SUBSETS = 2;
	const uint32_t ENDPOINTS = 4;
	const uint32_t COMPS = (mode == 7) ? 4 : 3;
	const uint32_t WEIGHT_BITS = (mode == 1) ? 3 : 2;
	const uint32_t ENDPOINT_BITS = (mode == 7) ? 5 : ((mode == 1) ? 6 : 7);
	const uint32_t PBITS = (mode == 1) ? 2 : 4;
	const uint32_t SHARED_PBITS = (mode == 1) ? true : false;
	const uint32_t WEIGHT_VALS = 1 << WEIGHT_BITS;
		
	uint32_t bit_offset = 0;
	const uint8_t* pBuf = static_cast<const uint8_t*>(pBlock_bits);

	if (read_bits32(pBuf, bit_offset, mode + 1) != (1U << mode)) return false;

	const uint32_t part = read_bits32(pBuf, bit_offset, 6);

	color_rgba endpoints[ENDPOINTS];
	for (uint32_t c = 0; c < COMPS; c++)
		for (uint32_t e = 0; e < ENDPOINTS; e++)
			endpoints[e][c] = (uint8_t)read_bits32(pBuf, bit_offset, ENDPOINT_BITS);
		
	uint32_t pbits[4];
	for (uint32_t p = 0; p < PBITS; p++)
		pbits[p] = read_bits32(pBuf, bit_offset, 1);
						
	uint32_t weights[16];
	for (uint32_t i = 0; i < 16; i++)
		weights[i] = read_bits32(pBuf, bit_offset, ((!i) || (i == g_bc7_table_anchor_index_second_subset[part])) ? (WEIGHT_BITS - 1) : WEIGHT_BITS);
		
	assert(bit_offset == 128);

	for (uint32_t e = 0; e < ENDPOINTS; e++)
		for (uint32_t c = 0; c < 4; c++)
			endpoints[e][c] = (uint8_t)((c == ((mode == 7U) ? 4U : 3U)) ? 255 : bc7_dequant(endpoints[e][c], pbits[SHARED_PBITS ? (e >> 1) : e], ENDPOINT_BITS));
		
	color_rgba block_colors[2][8];
	for (uint32_t s = 0; s < 2; s++)
		for (uint32_t i = 0; i < WEIGHT_VALS; i++)
		{
			for (uint32_t c = 0; c < COMPS; c++)
				block_colors[s][i][c] = (uint8_t)bc7_interp(endpoints[s * 2 + 0][c], endpoints[s * 2 + 1][c], i, WEIGHT_BITS);
			block_colors[s][i][3] = (COMPS == 3) ? 255 : block_colors[s][i][3];
		}

	for (uint32_t i = 0; i < 16; i++)
		pPixels[i] = block_colors[g_bc7_partition2[part * 16 + i]][weights[i]];

	return true;
}